

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O1

int al_ustr_ncompare(ALLEGRO_USTR *us1,ALLEGRO_USTR *us2,int n)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int32_t iVar5;
  int32_t iVar6;
  int unaff_R12D;
  int pos2;
  int pos1;
  int local_38 [2];
  
  iVar4 = 0;
  local_38[0] = 0;
  local_38[1] = 0;
  if (0 < n) {
    do {
      iVar4 = unaff_R12D;
      iVar5 = al_ustr_get_next(us1,local_38 + 1);
      iVar6 = al_ustr_get_next(us2,local_38);
      if (iVar5 - iVar6 == 0) {
        if (iVar5 == -1) {
          bVar3 = false;
          iVar4 = 0;
        }
        else {
          iVar1 = n + -1;
          bVar3 = 1 < n;
          bVar2 = n < 2;
          n = iVar1;
          if (bVar2) {
            iVar4 = 0;
          }
        }
      }
      else {
        bVar3 = false;
        iVar4 = iVar5 - iVar6;
      }
      unaff_R12D = iVar4;
    } while (bVar3);
  }
  return iVar4;
}

Assistant:

int al_ustr_ncompare(const ALLEGRO_USTR *us1, const ALLEGRO_USTR *us2, int n)
{
   int pos1 = 0;
   int pos2 = 0;

   if (n <= 0)
      return 0;

   for (;;) {
      int32_t c1 = al_ustr_get_next(us1, &pos1);
      int32_t c2 = al_ustr_get_next(us2, &pos2);

      if (c1 != c2) {
         /* This happens to work even when one of c1 or c2 is -1. */
         return c1 - c2;
      }

      if ((c1 == -1) || (--n <= 0))
         return 0;
   }
}